

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O0

void __thiscall
sqlcheck::TestSuite_EnumFalsePositive_Test::~TestSuite_EnumFalsePositive_Test
          (TestSuite_EnumFalsePositive_Test *this)

{
  TestSuite_EnumFalsePositive_Test *this_local;
  
  ~TestSuite_EnumFalsePositive_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(TestSuite, EnumFalsePositive) {
  Configuration default_conf;
  default_conf.testing_mode = true;
  default_conf.verbose = false;

  std::unique_ptr<std::istringstream> stream(new std::istringstream());
  stream->str(
      "CREATE TABLE Bugsin ("
      "bug_id SERIAL PRIMARY KEY,"
      "phonenum varchar(20),"
      "date_reported DATE NOT NULL"
      ");\n"

     "CREATE TABLE Screenshots ("
      "bug_id   BIGINT UNSIGNED NOT NULL REFERENCES Bugsin (bug_id),"
      "image_id          BIGINT UNSIGNED NOT NULL,"
      "screenshot_path   VARCHAR(100),"
      "caption           VARCHAR(100),"
      "PRIMARY KEY       (bug_id, image_id),"
      "FOREIGN KEY (bug_id) REFERENCES Bugsin(bug_id)"
      ");\n"
  );
  default_conf.test_stream.reset(stream.release());
  Check(default_conf);
}